

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char sqlite3AffinityType(char *zIn,Column *pCol)

{
  int local_2c;
  Column *pCStack_28;
  int v;
  char *zChar;
  char aff;
  Column *pCStack_18;
  u32 h;
  Column *pCol_local;
  char *zIn_local;
  
  zChar._4_4_ = 0;
  zChar._3_1_ = 0x43;
  pCStack_28 = (Column *)0x0;
  pCol_local = (Column *)zIn;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  if (*(char *)&pCol_local->zName == '\0') goto LAB_0022d655;
                  zChar._4_4_ = zChar._4_4_ * 0x100 +
                                (uint)""[(int)(uint)*(byte *)&pCol_local->zName];
                  pCol_local = (Column *)((long)&pCol_local->zName + 1);
                  if (zChar._4_4_ != 0x63686172) break;
                  zChar._3_1_ = 0x42;
                  pCStack_28 = pCol_local;
                }
                if (zChar._4_4_ != 0x636c6f62) break;
                zChar._3_1_ = 0x42;
              }
              if (zChar._4_4_ != 0x74657874) break;
              zChar._3_1_ = 0x42;
            }
            if ((zChar._4_4_ != 0x626c6f62) || ((zChar._3_1_ != 0x43 && (zChar._3_1_ != 0x45))))
            break;
            zChar._3_1_ = 0x41;
            if (*(char *)&pCol_local->zName == '(') {
              pCStack_28 = pCol_local;
            }
          }
          if ((zChar._4_4_ != 0x7265616c) || (zChar._3_1_ != 0x43)) break;
          zChar._3_1_ = 0x45;
        }
        if ((zChar._4_4_ != 0x666c6f61) || (zChar._3_1_ != 0x43)) break;
        zChar._3_1_ = 0x45;
      }
      if ((zChar._4_4_ != 0x646f7562) || (zChar._3_1_ != 0x43)) break;
      zChar._3_1_ = 0x45;
    }
  } while ((zChar._4_4_ & 0xffffff) != 0x696e74);
  zChar._3_1_ = 0x44;
LAB_0022d655:
  if (pCol != (Column *)0x0) {
    local_2c = 0;
    pCStack_18 = pCol;
    if (zChar._3_1_ < 0x43) {
      if (pCStack_28 == (Column *)0x0) {
        local_2c = 0x10;
      }
      else {
        for (; *(char *)&pCStack_28->zName != '\0';
            pCStack_28 = (Column *)((long)&pCStack_28->zName + 1)) {
          if ((""[*(byte *)&pCStack_28->zName] & 4) != 0) {
            sqlite3GetInt32((char *)pCStack_28,&local_2c);
            break;
          }
        }
      }
    }
    local_2c = local_2c / 4 + 1;
    if (0xff < local_2c) {
      local_2c = 0xff;
    }
    pCStack_18->szEst = (u8)local_2c;
  }
  return zChar._3_1_;
}

Assistant:

SQLITE_PRIVATE char sqlite3AffinityType(const char *zIn, Column *pCol){
  u32 h = 0;
  char aff = SQLITE_AFF_NUMERIC;
  const char *zChar = 0;

  assert( zIn!=0 );
  while( zIn[0] ){
    h = (h<<8) + sqlite3UpperToLower[(*zIn)&0xff];
    zIn++;
    if( h==(('c'<<24)+('h'<<16)+('a'<<8)+'r') ){             /* CHAR */
      aff = SQLITE_AFF_TEXT;
      zChar = zIn;
    }else if( h==(('c'<<24)+('l'<<16)+('o'<<8)+'b') ){       /* CLOB */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('t'<<24)+('e'<<16)+('x'<<8)+'t') ){       /* TEXT */
      aff = SQLITE_AFF_TEXT;
    }else if( h==(('b'<<24)+('l'<<16)+('o'<<8)+'b')          /* BLOB */
        && (aff==SQLITE_AFF_NUMERIC || aff==SQLITE_AFF_REAL) ){
      aff = SQLITE_AFF_BLOB;
      if( zIn[0]=='(' ) zChar = zIn;
#ifndef SQLITE_OMIT_FLOATING_POINT
    }else if( h==(('r'<<24)+('e'<<16)+('a'<<8)+'l')          /* REAL */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('f'<<24)+('l'<<16)+('o'<<8)+'a')          /* FLOA */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
    }else if( h==(('d'<<24)+('o'<<16)+('u'<<8)+'b')          /* DOUB */
        && aff==SQLITE_AFF_NUMERIC ){
      aff = SQLITE_AFF_REAL;
#endif
    }else if( (h&0x00FFFFFF)==(('i'<<16)+('n'<<8)+'t') ){    /* INT */
      aff = SQLITE_AFF_INTEGER;
      break;
    }
  }

  /* If pCol is not NULL, store an estimate of the field size.  The
  ** estimate is scaled so that the size of an integer is 1.  */
  if( pCol ){
    int v = 0;   /* default size is approx 4 bytes */
    if( aff<SQLITE_AFF_NUMERIC ){
      if( zChar ){
        while( zChar[0] ){
          if( sqlite3Isdigit(zChar[0]) ){
            /* BLOB(k), VARCHAR(k), CHAR(k) -> r=(k/4+1) */
            sqlite3GetInt32(zChar, &v);
            break;
          }
          zChar++;
        }
      }else{
        v = 16;   /* BLOB, TEXT, CLOB -> r=5  (approx 20 bytes)*/
      }
    }
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( v>=sqlite3GlobalConfig.szSorterRef ){
      pCol->colFlags |= COLFLAG_SORTERREF;
    }
#endif
    v = v/4 + 1;
    if( v>255 ) v = 255;
    pCol->szEst = v;
  }
  return aff;
}